

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O0

void __thiscall
t_cpp_generator::generate_service_skeleton(t_cpp_generator *this,t_service *tservice)

{
  t_function *tfunction;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  t_program *ptVar3;
  char *pcVar4;
  ostream *poVar5;
  ulong uVar6;
  long lVar7;
  vector<t_function_*,_std::allocator<t_function_*>_> *__x;
  reference pptVar8;
  string *psVar9;
  int __oflag;
  string local_5d8;
  string local_5b8;
  string local_598;
  string local_578;
  string local_558;
  string local_538;
  string local_518;
  string local_4f8;
  string local_4d8;
  string local_4b8;
  string local_498;
  string local_478;
  string local_458;
  allocator local_431;
  string local_430;
  allocator local_409;
  string local_408;
  string local_3e8;
  string local_3c8;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_3a8;
  t_function **local_3a0;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_398;
  iterator f_iter;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string local_358;
  string local_338;
  string local_318 [32];
  string local_2f8;
  allocator local_2d1;
  string local_2d0 [32];
  undefined1 local_2b0 [8];
  ofstream_with_content_based_conditional_update f_skeleton;
  string local_108;
  string local_e8;
  undefined1 local_c8 [8];
  string ns;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_58 [8];
  string f_skeleton_name;
  string svcname;
  t_service *tservice_local;
  t_cpp_generator *this_local;
  
  iVar2 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])();
  std::__cxx11::string::string
            ((string *)(f_skeleton_name.field_2._M_local_buf + 8),
             (string *)CONCAT44(extraout_var,iVar2));
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&local_98);
  std::operator+(&local_78,&local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&f_skeleton_name.field_2 + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                 &local_78,"_server.skeleton.cpp");
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  ptVar3 = t_type::get_program(&tservice->super_t_type);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_108,"cpp",(allocator *)&f_skeleton.field_0x19f);
  t_program::get_namespace(&local_e8,ptVar3,&local_108);
  namespace_prefix((string *)local_c8,this,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator((allocator<char> *)&f_skeleton.field_0x19f);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_2b0);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2d0,pcVar4,&local_2d1);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_2b0,(char *)local_2d0,__oflag);
  std::__cxx11::string::~string(local_2d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
  poVar5 = std::operator<<((ostream *)local_2b0,
                           "// This autogenerated skeleton file illustrates how to build a server.")
  ;
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,
                           "// You should copy it to another filename to avoid overwriting it.");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"#include \"");
  ptVar3 = t_generator::get_program((t_generator *)this);
  get_include_prefix_abi_cxx11_(&local_2f8,this,ptVar3);
  poVar5 = std::operator<<(poVar5,(string *)&local_2f8);
  poVar5 = std::operator<<(poVar5,(string *)(f_skeleton_name.field_2._M_local_buf + 8));
  poVar5 = std::operator<<(poVar5,".h\"");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"#include <thrift/protocol/TBinaryProtocol.h>");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"#include <thrift/server/TSimpleServer.h>");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"#include <thrift/transport/TServerSocket.h>");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"#include <thrift/transport/TBufferTransports.h>");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"using namespace ::apache::thrift;");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"using namespace ::apache::thrift::protocol;");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"using namespace ::apache::thrift::transport;");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"using namespace ::apache::thrift::server;");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_2f8);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    iVar2 = std::__cxx11::string::compare(local_c8);
    if (iVar2 != 0) {
      poVar5 = std::operator<<((ostream *)local_2b0,"using namespace ");
      lVar7 = std::__cxx11::string::size();
      std::__cxx11::string::string(local_318,(string *)local_c8,0,lVar7 - 2);
      poVar5 = std::operator<<(poVar5,local_318);
      poVar5 = std::operator<<(poVar5,";");
      poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string(local_318);
    }
  }
  poVar5 = std::operator<<((ostream *)local_2b0,"class ");
  poVar5 = std::operator<<(poVar5,(string *)(f_skeleton_name.field_2._M_local_buf + 8));
  poVar5 = std::operator<<(poVar5,"Handler : virtual public ");
  poVar5 = std::operator<<(poVar5,(string *)(f_skeleton_name.field_2._M_local_buf + 8));
  poVar5 = std::operator<<(poVar5,"If {");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5," public:");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  t_generator::indent_abi_cxx11_(&local_338,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)local_2b0,(string *)&local_338);
  poVar5 = std::operator<<(poVar5,(string *)(f_skeleton_name.field_2._M_local_buf + 8));
  poVar5 = std::operator<<(poVar5,"Handler() {");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_358,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_358);
  poVar5 = std::operator<<(poVar5,"  // Your initialization goes here");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_
            ((string *)
             &functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)
                                  &functions.
                                   super__Vector_base<t_function_*,_std::allocator<t_function_*>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage);
  poVar5 = std::operator<<(poVar5,"}");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string
            ((string *)
             &functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_338);
  __x = t_service::get_functions(tservice);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter,__x);
  __gnu_cxx::
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
  __normal_iterator(&local_398);
  local_3a0 = (t_function **)
              std::vector<t_function_*,_std::allocator<t_function_*>_>::begin
                        ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  local_398._M_current = local_3a0;
  while( true ) {
    local_3a8._M_current =
         (t_function **)
         std::vector<t_function_*,_std::allocator<t_function_*>_>::end
                   ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
    bVar1 = __gnu_cxx::operator!=(&local_398,&local_3a8);
    if (!bVar1) break;
    pptVar8 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_398);
    (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x23])
              (this,local_2b0,*pptVar8);
    t_generator::indent_abi_cxx11_(&local_3c8,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)local_2b0,(string *)&local_3c8);
    pptVar8 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_398);
    tfunction = *pptVar8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_408,"",&local_409);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_430,"",&local_431);
    function_signature(&local_3e8,this,tfunction,&local_408,&local_430,true);
    poVar5 = std::operator<<(poVar5,(string *)&local_3e8);
    poVar5 = std::operator<<(poVar5," {");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_458,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&local_458);
    poVar5 = std::operator<<(poVar5,"  // Your implementation goes here");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_478,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&local_478);
    poVar5 = std::operator<<(poVar5,"  printf(\"");
    pptVar8 = __gnu_cxx::
              __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
              ::operator*(&local_398);
    psVar9 = t_function::get_name_abi_cxx11_(*pptVar8);
    poVar5 = std::operator<<(poVar5,(string *)psVar9);
    poVar5 = std::operator<<(poVar5,"\\n\");");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_498,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&local_498);
    poVar5 = std::operator<<(poVar5,"}");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_498);
    std::__cxx11::string::~string((string *)&local_478);
    std::__cxx11::string::~string((string *)&local_458);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::__cxx11::string::~string((string *)&local_430);
    std::allocator<char>::~allocator((allocator<char> *)&local_431);
    std::__cxx11::string::~string((string *)&local_408);
    std::allocator<char>::~allocator((allocator<char> *)&local_409);
    std::__cxx11::string::~string((string *)&local_3c8);
    __gnu_cxx::
    __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
    operator++(&local_398);
  }
  t_generator::indent_down((t_generator *)this);
  poVar5 = std::operator<<((ostream *)local_2b0,"};");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_4b8,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)local_2b0,(string *)&local_4b8);
  poVar5 = std::operator<<(poVar5,"int main(int argc, char **argv) {");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_4b8);
  t_generator::indent_up((t_generator *)this);
  t_generator::indent_abi_cxx11_(&local_4d8,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)local_2b0,(string *)&local_4d8);
  poVar5 = std::operator<<(poVar5,"int port = 9090;");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_4f8,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_4f8);
  poVar5 = std::operator<<(poVar5,"::std::shared_ptr<");
  poVar5 = std::operator<<(poVar5,(string *)(f_skeleton_name.field_2._M_local_buf + 8));
  poVar5 = std::operator<<(poVar5,"Handler> handler(new ");
  poVar5 = std::operator<<(poVar5,(string *)(f_skeleton_name.field_2._M_local_buf + 8));
  poVar5 = std::operator<<(poVar5,"Handler());");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_518,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_518);
  poVar5 = std::operator<<(poVar5,"::std::shared_ptr<TProcessor> processor(new ");
  poVar5 = std::operator<<(poVar5,(string *)(f_skeleton_name.field_2._M_local_buf + 8));
  poVar5 = std::operator<<(poVar5,"Processor(handler));");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_538,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_538);
  poVar5 = std::operator<<(poVar5,
                           "::std::shared_ptr<TServerTransport> serverTransport(new TServerSocket(port));"
                          );
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_558,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_558);
  poVar5 = std::operator<<(poVar5,
                           "::std::shared_ptr<TTransportFactory> transportFactory(new TBufferedTransportFactory());"
                          );
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_578,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_578);
  poVar5 = std::operator<<(poVar5,
                           "::std::shared_ptr<TProtocolFactory> protocolFactory(new TBinaryProtocolFactory());"
                          );
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_598,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_598);
  poVar5 = std::operator<<(poVar5,
                           "TSimpleServer server(processor, serverTransport, transportFactory, protocolFactory);"
                          );
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_5b8,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_5b8);
  poVar5 = std::operator<<(poVar5,"server.serve();");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_5d8,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_5d8);
  poVar5 = std::operator<<(poVar5,"return 0;");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_5d8);
  std::__cxx11::string::~string((string *)&local_5b8);
  std::__cxx11::string::~string((string *)&local_598);
  std::__cxx11::string::~string((string *)&local_578);
  std::__cxx11::string::~string((string *)&local_558);
  std::__cxx11::string::~string((string *)&local_538);
  std::__cxx11::string::~string((string *)&local_518);
  std::__cxx11::string::~string((string *)&local_4f8);
  std::__cxx11::string::~string((string *)&local_4d8);
  t_generator::indent_down((t_generator *)this);
  poVar5 = std::operator<<((ostream *)local_2b0,"}");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  iVar2 = 0x56b700;
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_2b0,iVar2);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::~vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  ~template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_2b0);
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(f_skeleton_name.field_2._M_local_buf + 8));
  return;
}

Assistant:

void t_cpp_generator::generate_service_skeleton(t_service* tservice) {
  string svcname = tservice->get_name();

  // Service implementation file includes
  string f_skeleton_name = get_out_dir() + svcname + "_server.skeleton.cpp";

  string ns = namespace_prefix(tservice->get_program()->get_namespace("cpp"));

  ofstream_with_content_based_conditional_update f_skeleton;
  f_skeleton.open(f_skeleton_name.c_str());
  f_skeleton << "// This autogenerated skeleton file illustrates how to build a server." << endl
             << "// You should copy it to another filename to avoid overwriting it." << endl << endl
             << "#include \"" << get_include_prefix(*get_program()) << svcname << ".h\"" << endl
             << "#include <thrift/protocol/TBinaryProtocol.h>" << endl
             << "#include <thrift/server/TSimpleServer.h>" << endl
             << "#include <thrift/transport/TServerSocket.h>" << endl
             << "#include <thrift/transport/TBufferTransports.h>" << endl << endl
             << "using namespace ::apache::thrift;" << endl
             << "using namespace ::apache::thrift::protocol;" << endl
             << "using namespace ::apache::thrift::transport;" << endl
             << "using namespace ::apache::thrift::server;" << endl << endl;

  // the following code would not compile:
  // using namespace ;
  // using namespace ::;
  if ((!ns.empty()) && (ns.compare(" ::") != 0)) {
    f_skeleton << "using namespace " << string(ns, 0, ns.size() - 2) << ";" << endl << endl;
  }

  f_skeleton << "class " << svcname << "Handler : virtual public " << svcname << "If {" << endl
             << " public:" << endl;
  indent_up();
  f_skeleton << indent() << svcname << "Handler() {" << endl << indent()
             << "  // Your initialization goes here" << endl << indent() << "}" << endl << endl;

  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    generate_java_doc(f_skeleton, *f_iter);
    f_skeleton << indent() << function_signature(*f_iter, "") << " {" << endl << indent()
               << "  // Your implementation goes here" << endl << indent() << "  printf(\""
               << (*f_iter)->get_name() << "\\n\");" << endl << indent() << "}" << endl << endl;
  }

  indent_down();
  f_skeleton << "};" << endl << endl;

  f_skeleton << indent() << "int main(int argc, char **argv) {" << endl;
  indent_up();
  f_skeleton
      << indent() << "int port = 9090;" << endl << indent() << "::std::shared_ptr<" << svcname
      << "Handler> handler(new " << svcname << "Handler());" << endl << indent()
      << "::std::shared_ptr<TProcessor> processor(new " << svcname << "Processor(handler));" << endl
      << indent() << "::std::shared_ptr<TServerTransport> serverTransport(new TServerSocket(port));"
      << endl << indent()
      << "::std::shared_ptr<TTransportFactory> transportFactory(new TBufferedTransportFactory());" << endl
      << indent() << "::std::shared_ptr<TProtocolFactory> protocolFactory(new TBinaryProtocolFactory());"
      << endl << endl << indent()
      << "TSimpleServer server(processor, serverTransport, transportFactory, protocolFactory);"
      << endl << indent() << "server.serve();" << endl << indent() << "return 0;" << endl;
  indent_down();
  f_skeleton << "}" << endl << endl;

  // Close the files
  f_skeleton.close();
}